

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_proxy.cpp
# Opt level: O3

void __thiscall TcpProxy::TcpProxy(TcpProxy *this,EventLoopGroup *group,string *listenport)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  undefined8 uVar2;
  element_type *local_58;
  _Any_data _Stack_50;
  undefined1 local_40 [32];
  
  this->group_ = group;
  (this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40._0_8_ = local_40 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"localhost","");
  Liby::EventLoopGroup::creatTcpServer
            ((EventLoopGroup *)&local_58,(string *)group,(string *)local_40);
  uVar2 = _Stack_50._M_unused._0_8_;
  peVar1 = local_58;
  local_58 = (element_type *)0x0;
  _Stack_50._M_unused._M_object = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->proxyServer_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_unused._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_unused._0_8_);
    }
  }
  if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
    operator_delete((void *)local_40._0_8_);
  }
  return;
}

Assistant:

TcpProxy(EventLoopGroup &group, const std::string &listenport)
        : group_(group) {
        proxyServer_ = group.creatTcpServer("localhost", listenport);
    }